

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

VRle operator-(VRect *rect,VRle *o)

{
  Data *pDVar1;
  Data *aObj;
  size_t in_RCX;
  long *in_RDX;
  void *__buf;
  int __fd;
  
  if ((*(int *)&(o->d).mModel < *(int *)&o[1].d.mModel) &&
     (*(int *)((long)&(o->d).mModel + 4) < *(int *)((long)&o[1].d.mModel + 4))) {
    pDVar1 = (Data *)_ZTWL14Scratch_Object();
    VRle::Data::reset(pDVar1);
    pDVar1 = (Data *)_ZTWL14Scratch_Object();
    VRle::Data::addRect(pDVar1,(VRect *)o);
    __fd = (int)o;
    vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)rect);
    pDVar1 = (Data *)vcow_ptr<VRle::Data>::write((vcow_ptr<VRle::Data> *)rect,__fd,__buf,in_RCX);
    aObj = (Data *)_ZTWL14Scratch_Object();
    VRle::Data::opSubstract(pDVar1,aObj,(Data *)(*in_RDX + 8));
  }
  else {
    rect->x1 = 0;
    rect->y1 = 0;
    vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)rect);
  }
  return (VRle)(vcow_ptr<VRle::Data>)rect;
}

Assistant:

VRle operator-(const VRect &rect, const VRle &o)
{
    if (rect.empty()) return {};

    Scratch_Object.reset();
    Scratch_Object.addRect(rect);

    VRle result;
    result.d.write().opSubstract(Scratch_Object, o.d.read());

    return result;
}